

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O2

void Int16_To_Int32(void *destinationBuffer,int destinationStride,void *sourceBuffer,
                   int sourceStride,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  PaInt16 *src;
  PaInt32 *dest;
  bool bVar1;
  
  while (bVar1 = count != 0, count = count - 1, bVar1) {
    *(uint *)destinationBuffer = (uint)*sourceBuffer << 0x10;
    sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 2);
    destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride * 4);
  }
  return;
}

Assistant:

static void Int16_To_Int32(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    PaInt16 *src = (PaInt16*)sourceBuffer;
    PaInt32 *dest =  (PaInt32*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {
        /* REVIEW: we should consider something like
            (*src << 16) | (*src & 0xFFFF)
        */

        *dest = *src << 16;

        src += sourceStride;
        dest += destinationStride;
    }
}